

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int stb_vorbis_get_frame_float(stb_vorbis *f,int *channels,float ***output)

{
  int iVar1;
  long *in_RDX;
  int *in_RSI;
  vorb *in_RDI;
  int i;
  int left;
  int right;
  int len;
  int local_30;
  int local_2c;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_RDI->push_mode == '\0') {
    iVar1 = vorbis_decode_packet
                      ((vorb *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                       (int *)in_RDI,in_RSI,(int *)in_RDX);
    if (iVar1 == 0) {
      in_RDI->channel_buffer_end = 0;
      in_RDI->channel_buffer_start = 0;
      iVar1 = 0;
    }
    else {
      iVar1 = vorbis_finish_frame((stb_vorbis *)
                                  CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8),
                                  (int)((ulong)in_RDI >> 0x20),(int)in_RDI,
                                  (int)((ulong)in_RSI >> 0x20));
      for (local_30 = 0; local_30 < in_RDI->channels; local_30 = local_30 + 1) {
        in_RDI->outputs[local_30] = in_RDI->channel_buffers[local_30] + local_2c;
      }
      in_RDI->channel_buffer_start = local_2c;
      in_RDI->channel_buffer_end = local_2c + iVar1;
      if (in_RSI != (int *)0x0) {
        *in_RSI = in_RDI->channels;
      }
      if (in_RDX != (long *)0x0) {
        *in_RDX = (long)in_RDI->outputs;
      }
    }
  }
  else {
    iVar1 = error(in_RDI,VORBIS_invalid_api_mixing);
  }
  return iVar1;
}

Assistant:

int stb_vorbis_get_frame_float(stb_vorbis *f, int *channels, float ***output)
{
   int len, right,left,i;
   if (IS_PUSH_MODE(f)) return error(f, VORBIS_invalid_api_mixing);

   if (!vorbis_decode_packet(f, &len, &left, &right)) {
      f->channel_buffer_start = f->channel_buffer_end = 0;
      return 0;
   }

   len = vorbis_finish_frame(f, len, left, right);
   for (i=0; i < f->channels; ++i)
      f->outputs[i] = f->channel_buffers[i] + left;

   f->channel_buffer_start = left;
   f->channel_buffer_end   = left+len;

   if (channels) *channels = f->channels;
   if (output)   *output = f->outputs;
   return len;
}